

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumented_benchmark.cpp
# Opt level: O2

void measurepopcnt(uint32_t n,uint32_t iterations,bool verbose)

{
  uint uVar1;
  result_type rVar2;
  unsigned_short *puVar3;
  size_t k;
  ulong uVar4;
  uint32_t i;
  uint32_t uVar5;
  undefined1 auVar6 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar7 [16];
  undefined1 extraout_var [56];
  undefined1 auVar9 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar10 [16];
  undefined1 in_ZMM3 [64];
  vector<int,_std::allocator<int>_> evts;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  allresults;
  unique_ptr<unsigned_short,_void_(*)(void_*)> dataholder;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> mins;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> results;
  vector<double,_std::allocator<double>_> avg;
  uniform_int_distribution<int> dis;
  LinuxEvents<0> unified;
  random_device rd;
  mt19937 gen;
  _Vector_base<int,_std::allocator<int>_> local_28e8;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  local_28c8;
  unique_ptr<unsigned_short,_void_(*)(void_*)> local_28b0;
  _Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_28a0;
  _Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_2888;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  local_2868;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  local_2850;
  _Vector_base<int,_std::allocator<int>_> local_2838;
  _Vector_base<double,_std::allocator<double>_> local_2820;
  param_type local_2808;
  LinuxEvents<0> local_2800;
  anon_union_5000_2_650ea050_for_random_device_0 local_2740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  undefined1 auVar8 [64];
  
  local_28e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar3 = (unsigned_short *)malloc((ulong)n * 2);
  local_2740._M_mt._M_x[0]._0_4_ = 0;
  local_28b0._M_t.super___uniq_ptr_impl<unsigned_short,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_unsigned_short_*,_void_(*)(void_*)>.
  super__Tuple_impl<1UL,_void_(*)(void_*)>.super__Head_base<1UL,_void_(*)(void_*),_false>.
  _M_head_impl = (_Head_base<1UL,_void_(*)(void_*),_false>)free;
  local_28b0._M_t.super___uniq_ptr_impl<unsigned_short,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_unsigned_short_*,_void_(*)(void_*)>.
  super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl = puVar3;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&local_28e8,(int *)&local_2740);
  local_2740._M_mt._M_x[0]._0_4_ = 1;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&local_28e8,(int *)&local_2740);
  local_2740._M_mt._M_x[0]._0_4_ = 5;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&local_28e8,(int *)&local_2740);
  local_2740._M_mt._M_x[0]._0_4_ = 2;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&local_28e8,(int *)&local_2740);
  local_2740._M_mt._M_x[0]._0_4_ = 3;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&local_28e8,(int *)&local_2740);
  local_2740._M_mt._M_x[0]._0_4_ = 9;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&local_28e8,(int *)&local_2740);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_2838,
             (vector<int,_std::allocator<int>_> *)&local_28e8);
  LinuxEvents<0>::LinuxEvents(&local_2800,(vector<int,_std::allocator<int>_> *)&local_2838);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2838);
  local_28c8.
  super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2888._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2888._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2888._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28c8.
  super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28c8.
  super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::resize
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)&local_2888,
             (long)local_28e8._M_impl.super__Vector_impl_data._M_finish -
             (long)local_28e8._M_impl.super__Vector_impl_data._M_start >> 2);
  std::random_device::random_device((random_device *)&local_2740.field_0);
  uVar1 = std::random_device::_M_getval();
  auVar8._8_56_ = extraout_var;
  auVar8._0_8_ = extraout_XMM1_Qa;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13b8,(ulong)uVar1);
  uVar5 = 0;
  local_2808._M_a = 0;
  local_2808._M_b = 0xffff;
  while( true ) {
    auVar9 = in_ZMM2._0_16_;
    auVar7 = auVar8._0_16_;
    auVar10 = in_ZMM3._0_16_;
    if (uVar5 == iterations) break;
    for (uVar4 = 0; n != uVar4; uVar4 = uVar4 + 1) {
      rVar2 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&local_2808,&local_13b8);
      puVar3[uVar4] = (unsigned_short)rVar2;
    }
    LinuxEvents<0>::start(&local_2800);
    LinuxEvents<0>::end(&local_2800,
                        (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                        &local_2888);
    std::
    vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
    ::push_back(&local_28c8,(value_type *)&local_2888);
    uVar5 = uVar5 + 1;
  }
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::vector(&local_2850,&local_28c8);
  compute_mins((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)&local_28a0,
               &local_2850);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector(&local_2850);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::vector(&local_2868,&local_28c8);
  compute_averages((vector<double,_std::allocator<double>_> *)&local_2820,&local_2868);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector(&local_2868);
  printf("%-40s\t","avx512popcnt");
  if (verbose) {
    auVar6 = vcvtuqq2pd_avx512vl(*(undefined1 (*) [16])
                                  local_28a0._M_impl.super__Vector_impl_data._M_start);
    auVar7 = vshufpd_avx(auVar6,auVar6,1);
    auVar9 = vcvtusi2sd_avx512f(auVar10,n & 0xffffffe0);
    printf("instructions per cycle %4.2f, cycles per 16-bit word:  %4.3f, instructions per 16-bit word %4.3f \n"
           ,auVar7._0_8_ / auVar6._0_8_,auVar6._0_8_ / auVar9._0_8_,auVar7._0_8_ / auVar9._0_8_);
    printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu cache ref., %8llu cache mis.\n"
           ,*(undefined8 *)(undefined1 *)local_28a0._M_impl.super__Vector_impl_data._M_start,
           *(undefined8 *)((undefined1 *)local_28a0._M_impl.super__Vector_impl_data._M_start + 8),
           *(undefined8 *)
            *(undefined1 (*) [16])((long)local_28a0._M_impl.super__Vector_impl_data._M_start + 0x10)
           ,*(undefined8 *)
             (*(undefined1 (*) [16])
               ((long)local_28a0._M_impl.super__Vector_impl_data._M_start + 0x10) + 8),
           *(undefined8 *)
            *(undefined1 (*) [16])((long)local_28a0._M_impl.super__Vector_impl_data._M_start + 0x20)
          );
    printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f cache ref., %8.1f cache mis.\n"
           ,*local_2820._M_impl.super__Vector_impl_data._M_start,
           local_2820._M_impl.super__Vector_impl_data._M_start[1],
           local_2820._M_impl.super__Vector_impl_data._M_start[2],
           local_2820._M_impl.super__Vector_impl_data._M_start[3],
           local_2820._M_impl.super__Vector_impl_data._M_start[4]);
  }
  else {
    auVar10 = vcvtusi2sd_avx512f(auVar7,*(undefined8 *)
                                         (undefined1 *)
                                         local_28a0._M_impl.super__Vector_impl_data._M_start);
    auVar7 = vcvtusi2sd_avx512f(auVar7,n & 0xffffffe0);
    auVar9 = vcvtusi2sd_avx512f(auVar9,*(undefined8 *)
                                        (*(undefined1 (*) [16])
                                          ((long)local_28a0._M_impl.super__Vector_impl_data._M_start
                                          + 0x20) + 8));
    printf("cycles per 16-bit word:  %4.3f; ref cycles per 16-bit word: %4.3f \n",
           auVar10._0_8_ / auVar7._0_8_,auVar9._0_8_ / auVar7._0_8_);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_2820);
  std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
            (&local_28a0);
  std::random_device::~random_device((random_device *)&local_2740.field_0);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector(&local_28c8);
  std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
            (&local_2888);
  LinuxEvents<0>::~LinuxEvents(&local_2800);
  std::unique_ptr<unsigned_short,_void_(*)(void_*)>::~unique_ptr(&local_28b0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_28e8);
  return;
}

Assistant:

void measurepopcnt(uint32_t n, uint32_t iterations, bool verbose) {
    std::vector<int> evts;
    uint16_t* vdata = (uint16_t*)memory_allocate(n * sizeof(uint16_t));
    std::unique_ptr<uint16_t, decltype(&free)> dataholder(vdata, free);
    evts.push_back(PERF_COUNT_HW_CPU_CYCLES);
    evts.push_back(PERF_COUNT_HW_INSTRUCTIONS);
    evts.push_back(PERF_COUNT_HW_BRANCH_MISSES);
    evts.push_back(PERF_COUNT_HW_CACHE_REFERENCES);
    evts.push_back(PERF_COUNT_HW_CACHE_MISSES);
    evts.push_back(PERF_COUNT_HW_REF_CPU_CYCLES);
    LinuxEvents<PERF_TYPE_HARDWARE> unified(evts);
    std::vector<unsigned long long> results; // tmp buffer
    std::vector< std::vector<unsigned long long> > allresults;
    results.resize(evts.size());
    
    std::random_device rd;
    std::mt19937 gen(rd());
    std::uniform_int_distribution<> dis(0, 0xFFFF);

    for (uint32_t i = 0; i < iterations; i++) {
        for (size_t k = 0; k < n; k++) {
            vdata[k] = dis(gen); // random init.
        }
#if POSPOPCNT_SIMD_VERSION >= 6        
        uint64_t expected = popcnt_harley_seal((const __m512i*) vdata, n / (512 / 16));
        unified.start();
        uint64_t measured = popcnt_harley_seal((const __m512i*) vdata, n / (512 / 16));
        unified.end(results);
#elif POSPOPCNT_SIMD_VERSION >= 5
        uint64_t expected = popcnt_avx2((const __m256i*) vdata, n / (256 / 16));
        unified.start();
        uint64_t measured = popcnt_avx2((const __m256i*) vdata, n / (256 / 16));
        unified.end(results);
#endif
        assert(measured == expected);
        allresults.push_back(results);
    }

#if POSPOPCNT_SIMD_VERSION >= 6    
    n = n / (512 / 16) * (512 / 16);
#elif POSPOPCNT_SIMD_VERSION >= 5
    n = n / (256 / 16) * (256 / 16);
#endif

    std::vector<unsigned long long> mins = compute_mins(allresults);
    std::vector<double> avg = compute_averages(allresults);
#if POSPOPCNT_SIMD_VERSION >= 6 
    printf("%-40s\t","avx512popcnt");    
#elif POSPOPCNT_SIMD_VERSION >= 5
    printf("%-40s\t","avx256popcnt");  
#endif
    if (verbose) {
        printf("instructions per cycle %4.2f, cycles per 16-bit word:  %4.3f, "
               "instructions per 16-bit word %4.3f \n",
                double(mins[1]) / mins[0], double(mins[0]) / n, double(mins[1]) / n);
        // first we display mins
        printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu "
               "cache ref., %8llu cache mis.\n",
                mins[0], mins[1], mins[2], mins[3], mins[4]);
        printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f "
               "cache ref., %8.1f cache mis.\n",
                avg[0], avg[1], avg[2], avg[3], avg[4]);
    } else {
        printf("cycles per 16-bit word:  %4.3f; ref cycles per 16-bit word: %4.3f \n", double(mins[0]) / n, double(mins[5]) / n);
    }
}